

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool project_aimed(source origin,wchar_t typ,wchar_t dir,wchar_t dam,wchar_t flg,object *obj)

{
  _Bool _Var1;
  uint32_t uVar2;
  loc finish;
  monster *pmVar3;
  wchar_t wVar4;
  int iVar5;
  source origin_00;
  loc grid;
  
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  finish = (loc)loc(-1,-1);
  wVar4 = flg | 4;
  grid = finish;
  if (origin_00.what == SRC_PLAYER) {
    if ((dir == L'\x05') && (_Var1 = target_okay(), _Var1)) {
      target_get((loc_conflict *)&grid);
      finish = grid;
    }
    else {
      finish = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
      grid = finish;
    }
    goto LAB_00139286;
  }
  if (origin_00.what == SRC_MONSTER) {
    pmVar3 = cave_monster(cave,origin.which._0_4_);
    if (pmVar3 == (monster *)0x0) goto LAB_00139286;
    wVar4 = monster_effect_level(pmVar3,L'\x02');
    iVar5 = 100;
    for (; wVar4 != L'\0'; wVar4 = wVar4 + L'\xffffffff') {
      iVar5 = (iVar5 * 0x3c) / 100;
    }
    uVar2 = Rand_div(100);
    if ((int)uVar2 < iVar5) {
      wVar4 = (pmVar3->target).midx;
      if (wVar4 < L'\x01') {
        _Var1 = monster_is_decoyed(pmVar3);
        if (!_Var1) goto LAB_0013921a;
        finish = cave_find_decoy(cave);
      }
      else {
        pmVar3 = cave_monster(cave,wVar4);
        finish.x = (pmVar3->grid).x;
        finish.y = (pmVar3->grid).y;
      }
    }
    else {
      uVar2 = Rand_div(9);
      finish = (loc)loc_sum(pmVar3->grid,(loc_conflict)ddgrid[(long)(int)uVar2 + 1]);
    }
  }
  else {
LAB_0013921a:
    finish.x = (player->grid).x;
    finish.y = (player->grid).y;
  }
  wVar4 = flg | 0x804;
  grid = finish;
LAB_00139286:
  origin_00._4_4_ = 0;
  _Var1 = project(origin_00,L'\0',finish,dam,typ,wVar4,L'\0','\0',obj);
  return _Var1;
}

Assistant:

static bool project_aimed(struct source origin,
						  int typ, int dir, int dam, int flg,
						  const struct object *obj)
{
	struct loc grid = loc(-1, -1);

	/* Pass through the target if needed */
	flg |= (PROJECT_THRU);

	get_target(origin, dir, &grid, &flg);

	/* Aim at the target, do NOT explode */
	return (project(origin, 0, grid, dam, typ, flg, 0, 0, obj));
}